

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int push_key_share_entry(ptls_buffer_t *buf,uint16_t group,ptls_iovec_t pubkey)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  undefined1 local_22 [2];
  
  iVar2 = ptls_buffer__do_pushv(buf,local_22,2);
  if (iVar2 == 0) {
    iVar2 = ptls_buffer__do_pushv(buf,"",2);
    if (iVar2 == 0) {
      sVar1 = buf->off;
      iVar2 = ptls_buffer__do_pushv(buf,pubkey.base,pubkey.len);
      if (iVar2 == 0) {
        lVar3 = buf->off - sVar1;
        buf->base[sVar1 - 2] = (uint8_t)((ulong)lVar3 >> 8);
        buf->base[sVar1 - 1] = (uint8_t)lVar3;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int push_key_share_entry(ptls_buffer_t *buf, uint16_t group, ptls_iovec_t pubkey)
{
    int ret;

    ptls_buffer_push16(buf, group);
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, pubkey.base, pubkey.len); });
    ret = 0;
Exit:
    return ret;
}